

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gelu_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::GELU_x86_avx::forward_inplace(GELU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  __m256 x;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  float fVar20;
  float fVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  long *in_RSI;
  long *in_RDI;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar32;
  undefined8 uVar30;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar38;
  undefined8 uVar36;
  undefined8 uVar37;
  float fVar39;
  float fVar41;
  undefined8 uVar40;
  float fVar42;
  undefined1 auVar31 [32];
  undefined8 uVar43;
  v4sf afVar44;
  __m128 _blob_1;
  __m128 _cube_1;
  __m128 _pLoad_1;
  __m128 _fast2c128;
  __m128 _fast1c128;
  __m128 _one128;
  __m128 _half128;
  __m256 _blob;
  __m256 _cube;
  __m256 _pLoad;
  __m256 _fast2c256;
  __m256 _fast1c256;
  __m256 _one256;
  __m256 _half256;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int elempack;
  int h;
  int w;
  Mat *m;
  undefined8 local_7f0;
  undefined8 uStackY_7e8;
  undefined8 in_stack_fffffffffffff858;
  undefined8 in_stack_fffffffffffff860;
  undefined8 in_stack_fffffffffffff868;
  undefined8 in_stack_fffffffffffff870;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  Option *in_stack_fffffffffffff8f8;
  undefined8 uVar45;
  Mat *in_stack_fffffffffffff900;
  undefined8 uVar46;
  GELU *in_stack_fffffffffffff908;
  undefined8 uVar47;
  int local_688;
  undefined8 local_678;
  undefined8 local_670;
  undefined8 local_668;
  undefined4 local_660;
  long local_658;
  undefined4 local_650;
  undefined4 local_64c;
  undefined4 local_648;
  undefined4 local_644;
  undefined4 local_640;
  undefined8 local_638;
  float *local_630;
  int local_628;
  int local_624;
  int local_620;
  int local_61c;
  int local_618;
  int local_614;
  long *local_608;
  int local_5f4;
  undefined1 local_5ed;
  int local_5ec;
  undefined8 *local_5e0;
  undefined8 *local_5d8;
  undefined8 *local_5c8;
  undefined4 local_5b8;
  undefined4 local_5b4;
  undefined4 local_5b0;
  undefined4 local_5ac;
  float *local_5a8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  float *local_378;
  undefined4 local_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  undefined4 local_354;
  undefined4 local_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined4 local_334;
  undefined4 local_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  undefined4 uStack_324;
  undefined4 local_314;
  undefined4 local_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined4 local_2fc;
  float *local_2f8;
  float local_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float *local_1d8;
  long local_1d0;
  undefined4 local_1c4;
  long local_1c0;
  float *local_1b8;
  undefined4 local_1ac;
  int local_1a8;
  int local_1a4;
  undefined8 *local_1a0;
  undefined4 local_194;
  long local_190;
  undefined8 *local_170;
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 local_110;
  undefined4 local_10c;
  undefined4 local_108;
  undefined4 local_104;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined4 local_e0;
  undefined4 local_dc;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined1 local_80 [32];
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
    local_5f4 = GELU::forward_inplace
                          (in_stack_fffffffffffff908,in_stack_fffffffffffff900,
                           in_stack_fffffffffffff8f8);
  }
  else {
    local_614 = *(int *)((long)in_RSI + 0x2c);
    local_618 = (int)in_RSI[6];
    local_61c = (int)in_RSI[3];
    local_620 = (int)in_RSI[7];
    local_624 = local_614 * local_618 * local_61c;
    local_608 = in_RSI;
    for (local_628 = 0; local_628 < local_620; local_628 = local_628 + 1) {
      local_5e0 = &local_678;
      local_1a4 = *(int *)((long)local_608 + 0x2c);
      local_1a8 = (int)local_608[6];
      local_1ac = *(undefined4 *)((long)local_608 + 0x34);
      local_630 = (float *)(*local_608 + local_608[8] * (long)local_628 * local_608[2]);
      local_1c0 = local_608[2];
      local_1c4 = (undefined4)local_608[3];
      local_1d0 = local_608[4];
      local_1a0 = &local_678;
      local_190 = (long)local_1a4 * (long)local_1a8 * local_1c0;
      local_5d8 = &local_678;
      local_5c8 = &local_678;
      local_194 = 0x10;
      local_5ec = local_628;
      local_5ed = 1;
      local_678 = 0;
      local_668 = 0;
      local_660 = 0;
      local_650 = 0;
      local_64c = 0;
      local_648 = 0;
      local_644 = 0;
      local_640 = 0;
      local_638 = 0;
      local_670 = 0;
      local_688 = 0;
      local_5ac = 0x3f000000;
      local_104 = 0x3f000000;
      local_108 = 0x3f000000;
      local_10c = 0x3f000000;
      local_110 = 0x3f000000;
      local_114 = 0x3f000000;
      local_118 = 0x3f000000;
      local_11c = 0x3f000000;
      local_120 = 0x3f000000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f000000),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f000000),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f000000),0x20);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f000000),0x30);
      local_140._0_8_ = auVar2._0_8_;
      uVar9 = local_140._0_8_;
      local_140._8_8_ = auVar2._8_8_;
      uVar10 = local_140._8_8_;
      auStack_130._0_8_ = auVar3._0_8_;
      uVar37 = auStack_130._0_8_;
      auStack_130._8_8_ = auVar3._8_8_;
      uVar22 = auStack_130._8_8_;
      local_5b0 = 0x3f800000;
      local_c4 = 0x3f800000;
      local_c8 = 0x3f800000;
      local_cc = 0x3f800000;
      local_d0 = 0x3f800000;
      local_d4 = 0x3f800000;
      local_d8 = 0x3f800000;
      local_dc = 0x3f800000;
      local_e0 = 0x3f800000;
      auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
      auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
      local_100._0_8_ = auVar4._0_8_;
      uVar23 = local_100._0_8_;
      local_100._8_8_ = auVar4._8_8_;
      uVar24 = local_100._8_8_;
      auStack_f0._0_8_ = auVar5._0_8_;
      uVar25 = auStack_f0._0_8_;
      auStack_f0._8_8_ = auVar5._8_8_;
      uVar26 = auStack_f0._8_8_;
      local_5b4 = 0x3f4c4229;
      local_84 = 0x3f4c4229;
      local_88 = 0x3f4c4229;
      local_8c = 0x3f4c4229;
      local_90 = 0x3f4c4229;
      local_94 = 0x3f4c4229;
      local_98 = 0x3f4c4229;
      local_9c = 0x3f4c4229;
      local_a0 = 0x3f4c4229;
      auVar6 = vinsertps_avx(ZEXT416(0x3f4c4229),ZEXT416(0x3f4c4229),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f4c4229),0x20);
      local_c0 = vinsertps_avx(auVar6,ZEXT416(0x3f4c4229),0x30);
      auVar6 = vinsertps_avx(ZEXT416(0x3f4c4229),ZEXT416(0x3f4c4229),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f4c4229),0x20);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f4c4229),0x30);
      auStack_b0._0_8_ = auVar6._0_8_;
      uVar15 = auStack_b0._0_8_;
      auStack_b0._8_8_ = auVar6._8_8_;
      uVar16 = auStack_b0._8_8_;
      local_5b8 = 0x3d372713;
      local_34 = 0x3d372713;
      local_38 = 0x3d372713;
      local_3c = 0x3d372713;
      local_40 = 0x3d372713;
      local_44 = 0x3d372713;
      local_48 = 0x3d372713;
      local_4c = 0x3d372713;
      local_50 = 0x3d372713;
      auVar7 = vinsertps_avx(ZEXT416(0x3d372713),ZEXT416(0x3d372713),0x10);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3d372713),0x20);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3d372713),0x30);
      auVar8 = vinsertps_avx(ZEXT416(0x3d372713),ZEXT416(0x3d372713),0x10);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3d372713),0x20);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3d372713),0x30);
      auVar31._16_16_ = auVar7;
      auVar31._0_16_ = auVar8;
      local_80._0_8_ = auVar8._0_8_;
      uVar17 = local_80._0_8_;
      local_80._8_8_ = auVar8._8_8_;
      uVar18 = local_80._8_8_;
      local_80._16_8_ = auVar7._0_8_;
      uVar19 = local_80._16_8_;
      local_80._24_8_ = auVar7._8_8_;
      uVar45 = local_80._24_8_;
      uVar46 = local_c0._0_8_;
      uVar47 = local_c0._8_8_;
      local_1b8 = local_630;
      local_170 = local_5c8;
      local_140 = auVar2;
      auStack_130 = auVar3;
      local_100 = auVar4;
      auStack_f0 = auVar5;
      auStack_b0 = auVar6;
      local_80 = auVar31;
      local_658 = local_1d0;
      for (; local_688 + 7 < local_624; local_688 = local_688 + 8) {
        local_5a8 = local_630;
        uVar11 = *(undefined8 *)local_630;
        uVar12 = *(undefined8 *)(local_630 + 2);
        uVar13 = *(undefined8 *)(local_630 + 4);
        uVar14 = *(undefined8 *)(local_630 + 6);
        local_440._0_4_ = (float)uVar11;
        fVar1 = (float)local_440;
        local_440._4_4_ = (float)((ulong)uVar11 >> 0x20);
        fVar29 = local_440._4_4_;
        uStack_438._0_4_ = (float)uVar12;
        fVar20 = (float)uStack_438;
        uStack_438._4_4_ = (float)((ulong)uVar12 >> 0x20);
        fVar21 = uStack_438._4_4_;
        uStack_430._0_4_ = (float)uVar13;
        fVar28 = (float)uStack_430;
        uStack_430._4_4_ = (float)((ulong)uVar13 >> 0x20);
        fVar33 = uStack_430._4_4_;
        uStack_428._0_4_ = (float)uVar14;
        fVar35 = (float)uStack_428;
        uStack_428._4_4_ = (float)((ulong)uVar14 >> 0x20);
        local_4a0 = CONCAT44(local_440._4_4_ * local_440._4_4_,(float)local_440 * (float)local_440);
        uStack_498 = CONCAT44(uStack_438._4_4_ * uStack_438._4_4_,
                              (float)uStack_438 * (float)uStack_438);
        uStack_490 = CONCAT44(uStack_430._4_4_ * uStack_430._4_4_,
                              (float)uStack_430 * (float)uStack_430);
        uStack_488 = CONCAT44(uStack_428._4_4_,(float)uStack_428 * (float)uStack_428);
        fVar27 = (float)local_440 * (float)local_440 * (float)local_440;
        fVar32 = local_440._4_4_ * local_440._4_4_ * local_440._4_4_;
        fVar34 = (float)uStack_438 * (float)uStack_438 * (float)uStack_438;
        fVar38 = uStack_438._4_4_ * uStack_438._4_4_ * uStack_438._4_4_;
        fVar39 = (float)uStack_430 * (float)uStack_430 * (float)uStack_430;
        fVar41 = uStack_430._4_4_ * uStack_430._4_4_ * uStack_430._4_4_;
        fVar42 = (float)uStack_428 * (float)uStack_428 * (float)uStack_428;
        local_4e0 = CONCAT44(fVar32,fVar27);
        uStack_4d8 = CONCAT44(fVar38,fVar34);
        uStack_4d0 = CONCAT44(fVar41,fVar39);
        uStack_4c8 = CONCAT44(uStack_428._4_4_,fVar42);
        local_4c0 = uVar17;
        uStack_4b8 = uVar18;
        uStack_4b0 = uVar19;
        local_4c0._0_4_ = auVar8._0_4_;
        local_4c0._4_4_ = auVar8._4_4_;
        uStack_4b8._0_4_ = auVar8._8_4_;
        uStack_4b8._4_4_ = auVar8._12_4_;
        uStack_4b0._0_4_ = auVar7._0_4_;
        uStack_4b0._4_4_ = auVar7._4_4_;
        uStack_4a8._0_4_ = (float)uVar45;
        uStack_4a8._4_4_ = (float)((ulong)uVar45 >> 0x20);
        local_4c0._0_4_ = (float)local_4c0 * fVar27;
        local_4c0._4_4_ = local_4c0._4_4_ * fVar32;
        uStack_4b8._0_4_ = (float)uStack_4b8 * fVar34;
        uStack_4b8._4_4_ = uStack_4b8._4_4_ * fVar38;
        uStack_4b0._0_4_ = (float)uStack_4b0 * fVar39;
        uStack_4b0._4_4_ = uStack_4b0._4_4_ * fVar41;
        uStack_4a8._0_4_ = (float)uStack_4a8 * fVar42;
        local_780 = CONCAT44(local_4c0._4_4_,(float)local_4c0);
        uStack_778 = CONCAT44(uStack_4b8._4_4_,(float)uStack_4b8);
        uStack_770 = CONCAT44(uStack_4b0._4_4_,(float)uStack_4b0);
        uStack_768 = CONCAT44(uStack_4a8._4_4_,(float)uStack_4a8);
        local_3e0 = local_780;
        uStack_3d8 = uStack_778;
        uStack_3d0 = uStack_770;
        uStack_3c8 = uStack_768;
        local_440._0_4_ = (float)local_440 + (float)local_4c0;
        local_440._4_4_ = local_440._4_4_ + local_4c0._4_4_;
        uStack_438._0_4_ = (float)uStack_438 + (float)uStack_4b8;
        uStack_438._4_4_ = uStack_438._4_4_ + uStack_4b8._4_4_;
        uStack_430._0_4_ = (float)uStack_430 + (float)uStack_4b0;
        uStack_430._4_4_ = uStack_430._4_4_ + uStack_4b0._4_4_;
        uStack_428._0_4_ = (float)uStack_428 + (float)uStack_4a8;
        local_780 = CONCAT44(local_440._4_4_,(float)local_440);
        uStack_778 = CONCAT44(uStack_438._4_4_,(float)uStack_438);
        uStack_770 = CONCAT44(uStack_430._4_4_,(float)uStack_430);
        uStack_768 = CONCAT44(uStack_428._4_4_ + uStack_4a8._4_4_,(float)uStack_428);
        uStack_4f0 = uVar15;
        uStack_4e8 = uVar16;
        local_520 = local_780;
        uStack_518 = uStack_778;
        uStack_510 = uStack_770;
        uStack_508 = uStack_768;
        local_500._0_4_ = (float)uVar46;
        local_500._4_4_ = (float)((ulong)uVar46 >> 0x20);
        uStack_4f8._0_4_ = (float)uVar47;
        uStack_4f8._4_4_ = (float)((ulong)uVar47 >> 0x20);
        uStack_4f0._0_4_ = auVar6._0_4_;
        uStack_4f0._4_4_ = auVar6._4_4_;
        uStack_4e8._0_4_ = auVar6._8_4_;
        uStack_4e8._4_4_ = auVar6._12_4_;
        local_780 = CONCAT44(local_500._4_4_ * local_440._4_4_,(float)local_500 * (float)local_440);
        uStack_778 = CONCAT44(uStack_4f8._4_4_ * uStack_438._4_4_,
                              (float)uStack_4f8 * (float)uStack_438);
        uStack_770 = CONCAT44(uStack_4f0._4_4_ * uStack_430._4_4_,
                              (float)uStack_4f0 * (float)uStack_430);
        uStack_768 = CONCAT44(uStack_4e8._4_4_,(float)uStack_4e8 * (float)uStack_428);
        x[2] = (float)(int)in_stack_fffffffffffff860;
        x[3] = (float)(int)((ulong)in_stack_fffffffffffff860 >> 0x20);
        x[0] = (float)(int)in_stack_fffffffffffff858;
        x[1] = (float)(int)((ulong)in_stack_fffffffffffff858 >> 0x20);
        x[4] = (float)(int)in_stack_fffffffffffff868;
        x[5] = (float)(int)((ulong)in_stack_fffffffffffff868 >> 0x20);
        x[6] = (float)(int)in_stack_fffffffffffff870;
        x[7] = (float)(int)((ulong)in_stack_fffffffffffff870 >> 0x20);
        uVar30 = local_780;
        uVar36 = uStack_778;
        uVar40 = uStack_770;
        uVar43 = uStack_768;
        local_500 = uVar46;
        uStack_4f8 = uVar47;
        uStack_4f0 = uVar15;
        uStack_4e8 = uVar16;
        local_4c0 = uVar17;
        uStack_4b8 = uVar18;
        uStack_4b0 = uVar19;
        uStack_4a8 = uVar45;
        local_480 = uVar11;
        uStack_478 = uVar12;
        uStack_470 = uVar13;
        uStack_468 = uVar14;
        local_460 = uVar11;
        uStack_458 = uVar12;
        uStack_450 = uVar13;
        uStack_448 = uVar14;
        local_440 = uVar11;
        uStack_438 = uVar12;
        uStack_430 = uVar13;
        uStack_428 = uVar14;
        local_3c0 = uVar11;
        uStack_3b8 = uVar12;
        uStack_3b0 = uVar13;
        uStack_3a8 = uVar14;
        tanh256_ps(x);
        local_400._0_4_ = auVar4._0_4_;
        local_400._4_4_ = auVar4._4_4_;
        uStack_3f8._0_4_ = auVar4._8_4_;
        uStack_3f8._4_4_ = auVar4._12_4_;
        uStack_3f0._0_4_ = auVar5._0_4_;
        uStack_3f0._4_4_ = auVar5._4_4_;
        uStack_3e8._0_4_ = auVar5._8_4_;
        uStack_3e8._4_4_ = auVar5._12_4_;
        local_420._0_4_ = (float)uVar30;
        local_420._4_4_ = (float)((ulong)uVar30 >> 0x20);
        uStack_418._0_4_ = (float)uVar36;
        uStack_418._4_4_ = (float)((ulong)uVar36 >> 0x20);
        uStack_410._0_4_ = (float)uVar40;
        uStack_410._4_4_ = (float)((ulong)uVar40 >> 0x20);
        uStack_408._0_4_ = (float)uVar43;
        uStack_408._4_4_ = (float)((ulong)uVar43 >> 0x20);
        fStack_584 = uStack_3e8._4_4_ + uStack_408._4_4_;
        local_780 = CONCAT44(local_400._4_4_ + local_420._4_4_,(float)local_400 + (float)local_420);
        uStack_778 = CONCAT44(uStack_3f8._4_4_ + uStack_418._4_4_,
                              (float)uStack_3f8 + (float)uStack_418);
        uStack_770 = CONCAT44(uStack_3f0._4_4_ + uStack_410._4_4_,
                              (float)uStack_3f0 + (float)uStack_410);
        uStack_768 = CONCAT44(fStack_584,(float)uStack_3e8 + (float)uStack_408);
        local_540 = local_780;
        uStack_538 = uStack_778;
        uStack_530 = uStack_770;
        uStack_528 = uStack_768;
        local_5a0 = ((float)local_400 + (float)local_420) * fVar1;
        fStack_59c = (local_400._4_4_ + local_420._4_4_) * fVar29;
        fStack_598 = ((float)uStack_3f8 + (float)uStack_418) * fVar20;
        fStack_594 = (uStack_3f8._4_4_ + uStack_418._4_4_) * fVar21;
        fStack_590 = ((float)uStack_3f0 + (float)uStack_410) * fVar28;
        fStack_58c = (uStack_3f0._4_4_ + uStack_410._4_4_) * fVar33;
        fStack_588 = ((float)uStack_3e8 + (float)uStack_408) * fVar35;
        local_580._0_4_ = auVar2._0_4_;
        local_580._4_4_ = auVar2._4_4_;
        uStack_578._0_4_ = auVar2._8_4_;
        uStack_578._4_4_ = auVar2._12_4_;
        uStack_570._0_4_ = auVar3._0_4_;
        uStack_570._4_4_ = auVar3._4_4_;
        uStack_568._0_4_ = auVar3._8_4_;
        uStack_568._4_4_ = auVar3._12_4_;
        local_780 = CONCAT44(local_580._4_4_ * fStack_59c,(float)local_580 * local_5a0);
        uStack_778 = CONCAT44(uStack_578._4_4_ * fStack_594,(float)uStack_578 * fStack_598);
        uStack_770 = CONCAT44(uStack_570._4_4_ * fStack_58c,(float)uStack_570 * fStack_590);
        uStack_768 = CONCAT44(uStack_568._4_4_,(float)uStack_568 * fStack_588);
        local_378 = local_630;
        local_3a0 = local_780;
        uStack_398 = uStack_778;
        uStack_390 = uStack_770;
        uStack_388 = uStack_768;
        *(undefined8 *)local_630 = local_780;
        *(undefined8 *)(local_630 + 2) = uStack_778;
        *(undefined8 *)(local_630 + 4) = uStack_770;
        *(undefined8 *)(local_630 + 6) = uStack_768;
        local_630 = local_630 + 8;
        local_580 = uVar9;
        uStack_578 = uVar10;
        uStack_570 = uVar37;
        uStack_568 = uVar22;
        local_560 = uVar11;
        uStack_558 = uVar12;
        uStack_550 = uVar13;
        uStack_548 = uVar14;
        local_420 = uVar30;
        uStack_418 = uVar36;
        uStack_410 = uVar40;
        uStack_408 = uVar43;
        local_400 = uVar23;
        uStack_3f8 = uVar24;
        uStack_3f0 = uVar25;
        uStack_3e8 = uVar26;
      }
      local_2fc = 0x3f000000;
      local_310 = 0x3f000000;
      uStack_30c = 0x3f000000;
      uStack_308 = 0x3f000000;
      uStack_304 = 0x3f000000;
      in_stack_fffffffffffff870 = 0x3f0000003f000000;
      local_314 = 0x3f800000;
      local_330 = 0x3f800000;
      uStack_32c = 0x3f800000;
      uStack_328 = 0x3f800000;
      uStack_324 = 0x3f800000;
      in_stack_fffffffffffff860 = 0x3f8000003f800000;
      in_stack_fffffffffffff868 = 0x3f8000003f800000;
      local_334 = 0x3f4c4229;
      local_350 = 0x3f4c4229;
      uStack_34c = 0x3f4c4229;
      uStack_348 = 0x3f4c4229;
      uStack_344 = 0x3f4c4229;
      in_stack_fffffffffffff858 = 0x3f4c42293f4c4229;
      local_354 = 0x3d372713;
      local_370 = 0x3d372713;
      uStack_36c = 0x3d372713;
      uStack_368 = 0x3d372713;
      uStack_364 = 0x3d372713;
      for (; local_688 + 3 < local_624; local_688 = local_688 + 4) {
        local_2f8 = local_630;
        uVar9 = *(undefined8 *)local_630;
        uVar10 = *(undefined8 *)(local_630 + 2);
        local_240._0_4_ = (float)uVar9;
        fVar1 = (float)local_240;
        local_240._4_4_ = (float)((ulong)uVar9 >> 0x20);
        fVar29 = local_240._4_4_;
        uStack_238._0_4_ = (float)uVar10;
        fVar20 = (float)uStack_238;
        uStack_238._4_4_ = (float)((ulong)uVar10 >> 0x20);
        fVar21 = uStack_238._4_4_;
        local_270 = CONCAT44(local_240._4_4_ * local_240._4_4_,(float)local_240 * (float)local_240);
        uStack_268 = CONCAT44(uStack_238._4_4_ * uStack_238._4_4_,
                              (float)uStack_238 * (float)uStack_238);
        fVar28 = (float)local_240 * (float)local_240 * (float)local_240;
        fVar33 = local_240._4_4_ * local_240._4_4_ * local_240._4_4_;
        fVar35 = (float)uStack_238 * (float)uStack_238 * (float)uStack_238;
        fVar27 = uStack_238._4_4_ * uStack_238._4_4_ * uStack_238._4_4_;
        local_290 = CONCAT44(fVar33,fVar28);
        uStack_288 = CONCAT44(fVar27,fVar35);
        fVar28 = fVar28 * 0.044715;
        fVar33 = fVar33 * 0.044715;
        fVar35 = fVar35 * 0.044715;
        fVar27 = fVar27 * 0.044715;
        local_7f0 = CONCAT44(fVar33,fVar28);
        uStackY_7e8 = CONCAT44(fVar27,fVar35);
        local_210 = local_7f0;
        uStack_208 = uStackY_7e8;
        local_240._0_4_ = (float)local_240 + fVar28;
        local_240._4_4_ = local_240._4_4_ + fVar33;
        uStack_238._0_4_ = (float)uStack_238 + fVar35;
        uStack_238._4_4_ = uStack_238._4_4_ + fVar27;
        local_7f0 = CONCAT44(local_240._4_4_,(float)local_240);
        uStackY_7e8 = CONCAT44(uStack_238._4_4_,(float)uStack_238);
        local_2b0 = local_7f0;
        uStack_2a8 = uStackY_7e8;
        uStack_298._0_4_ = (float)in_stack_fffffffffffff858;
        uStack_298._4_4_ = (float)((ulong)in_stack_fffffffffffff858 >> 0x20);
        uStackY_7e8 = CONCAT44(uStack_298._4_4_ * uStack_238._4_4_,
                               (float)uStack_298 * (float)uStack_238);
        afVar44[2] = 0.7978845;
        afVar44[3] = 0.7978845;
        afVar44[0] = (float)local_240 * 0.7978845;
        afVar44[1] = local_240._4_4_ * 0.7978845;
        uVar37 = uStackY_7e8;
        local_2a0 = 0x3f4c42293f4c4229;
        uStack_298 = in_stack_fffffffffffff858;
        local_280 = 0x3d3727133d372713;
        uStack_278 = 0x3d3727133d372713;
        local_260 = uVar9;
        uStack_258 = uVar10;
        local_250 = uVar9;
        uStack_248 = uVar10;
        local_240 = uVar9;
        uStack_238 = uVar10;
        local_200 = uVar9;
        uStack_1f8 = uVar10;
        afVar44 = tanh_ps(afVar44);
        local_220._0_4_ = (float)in_stack_fffffffffffff860;
        local_220._4_4_ = (float)((ulong)in_stack_fffffffffffff860 >> 0x20);
        uStack_218._0_4_ = (float)in_stack_fffffffffffff868;
        uStack_218._4_4_ = (float)((ulong)in_stack_fffffffffffff868 >> 0x20);
        local_230._0_4_ = afVar44[0];
        local_230._4_4_ = afVar44[1];
        uStack_228._0_4_ = (float)uVar37;
        uStack_228._4_4_ = (float)((ulong)uVar37 >> 0x20);
        local_7f0 = CONCAT44(local_220._4_4_ + local_230._4_4_,(float)local_220 + (float)local_230);
        uStackY_7e8 = CONCAT44(uStack_218._4_4_ + uStack_228._4_4_,
                               (float)uStack_218 + (float)uStack_228);
        local_2c0 = local_7f0;
        uStack_2b8 = uStackY_7e8;
        local_2f0 = ((float)local_220 + (float)local_230) * fVar1;
        fStack_2ec = (local_220._4_4_ + local_230._4_4_) * fVar29;
        fStack_2e8 = ((float)uStack_218 + (float)uStack_228) * fVar20;
        fStack_2e4 = (uStack_218._4_4_ + uStack_228._4_4_) * fVar21;
        local_2e0._0_4_ = (float)in_stack_fffffffffffff870;
        local_2e0._4_4_ = (float)((ulong)in_stack_fffffffffffff870 >> 0x20);
        local_7f0 = CONCAT44(local_2e0._4_4_ * fStack_2ec,(float)local_2e0 * local_2f0);
        uStackY_7e8 = CONCAT44(fStack_2e4 * 0.5,fStack_2e8 * 0.5);
        local_1d8 = local_630;
        local_1f0 = local_7f0;
        uStack_1e8 = uStackY_7e8;
        *(undefined8 *)local_630 = local_7f0;
        *(undefined8 *)(local_630 + 2) = uStackY_7e8;
        local_630 = local_630 + 4;
        local_2e0 = in_stack_fffffffffffff870;
        uStack_2d8 = 0x3f0000003f000000;
        local_2d0 = uVar9;
        uStack_2c8 = uVar10;
        local_230 = afVar44._0_8_;
        uStack_228 = uVar37;
        local_220 = in_stack_fffffffffffff860;
        uStack_218 = in_stack_fffffffffffff868;
      }
      for (; local_688 < local_624; local_688 = local_688 + 1) {
        fVar1 = *local_630;
        fVar29 = tanhf((*local_630 + *local_630 * 0.044715 * *local_630 * *local_630) * 0.7978845);
        *local_630 = fVar1 * 0.5 * (fVar29 + 1.0);
        local_630 = local_630 + 1;
      }
    }
    local_5f4 = 0;
  }
  return local_5f4;
}

Assistant:

int GELU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (!fast_gelu)
    {
        return GELU::forward_inplace(bottom_top_blob, opt);
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _half512 = _mm512_set1_ps(0.5f);
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _fast1c512 = _mm512_set1_ps(0.79788452f);
        __m512 _fast2c512 = _mm512_set1_ps(0.044715f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _pLoad = _mm512_loadu_ps(ptr);

            __m512 _cube = _mm512_mul_ps(_pLoad, _pLoad);
            _cube = _mm512_mul_ps(_pLoad, _cube);

            __m512 _blob = _mm512_mul_ps(_fast2c512, _cube);
            _blob = _mm512_add_ps(_pLoad, _blob);
            _blob = _mm512_mul_ps(_fast1c512, _blob);
            _blob = tanh512_ps(_blob);
            _blob = _mm512_add_ps(_one512, _blob);

            _blob = _mm512_mul_ps(_half512, _mm512_mul_ps(_blob, _pLoad));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _half256 = _mm256_set1_ps(0.5f);
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _fast1c256 = _mm256_set1_ps(0.79788452f);
        __m256 _fast2c256 = _mm256_set1_ps(0.044715f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _pLoad = _mm256_loadu_ps(ptr);

            __m256 _cube = _mm256_mul_ps(_pLoad, _pLoad);
            _cube = _mm256_mul_ps(_pLoad, _cube);

            __m256 _blob = _mm256_mul_ps(_fast2c256, _cube);
            _blob = _mm256_add_ps(_pLoad, _blob);
            _blob = _mm256_mul_ps(_fast1c256, _blob);
            _blob = tanh256_ps(_blob);
            _blob = _mm256_add_ps(_one256, _blob);

            _blob = _mm256_mul_ps(_half256, _mm256_mul_ps(_blob, _pLoad));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _half128 = _mm_set1_ps(0.5f);
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _fast1c128 = _mm_set1_ps(0.79788452f);
        __m128 _fast2c128 = _mm_set1_ps(0.044715f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _pLoad = _mm_loadu_ps(ptr);

            __m128 _cube = _mm_mul_ps(_pLoad, _pLoad);
            _cube = _mm_mul_ps(_pLoad, _cube);

            __m128 _blob = _mm_mul_ps(_fast2c128, _cube);
            _blob = _mm_add_ps(_pLoad, _blob);
            _blob = _mm_mul_ps(_fast1c128, _blob);
            _blob = tanh_ps(_blob);
            _blob = _mm_add_ps(_one128, _blob);

            _blob = _mm_mul_ps(_half128, _mm_mul_ps(_blob, _pLoad));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            // y = 0.5x * (1 + tanh(sqrt(2/Pi) * (x + 0.044715x^3)))
            *ptr = 0.5f * *ptr * (1.0f + tanhf(0.79788452f * (*ptr + 0.044715f * *ptr * *ptr * *ptr)));

            ptr++;
        }
    }

    return 0;
}